

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.c
# Opt level: O2

void scheduler_fiber_proc_for_user_worker(cilk_fiber *fiber)

{
  __cilkrts_worker *w;
  char *pcVar1;
  undefined8 uVar2;
  
  w = (fiber->super_cilk_fiber_data).owner;
  if (w == (__cilkrts_worker *)0x0) {
    pcVar1 = "w";
    uVar2 = 0x756;
  }
  else {
    if (w->l->type == WORKER_USER) {
      __cilkrts_run_scheduler_with_exceptions(w);
      return;
    }
    pcVar1 = "WORKER_USER == w->l->type";
    uVar2 = 0x759;
  }
  __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/scheduler.c"
                ,uVar2,pcVar1);
}

Assistant:

COMMON_PORTABLE
void scheduler_fiber_proc_for_user_worker(cilk_fiber *fiber)
{
    __cilkrts_worker* w = cilk_fiber_get_owner(fiber);
    CILK_ASSERT(w);

    // This must be a user worker
    CILK_ASSERT(WORKER_USER == w->l->type);

    // If we aren't the current worker, then something is very wrong
    // here..
    verify_current_wkr(w);

    __cilkrts_run_scheduler_with_exceptions(w);
}